

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dhm.c
# Opt level: O3

void mbedtls_dhm_free(mbedtls_dhm_context *ctx)

{
  long lVar1;
  
  mbedtls_mpi_free(&ctx->pX);
  mbedtls_mpi_free(&ctx->Vf);
  mbedtls_mpi_free(&ctx->Vi);
  mbedtls_mpi_free(&ctx->RP);
  mbedtls_mpi_free(&ctx->K);
  mbedtls_mpi_free(&ctx->GY);
  mbedtls_mpi_free(&ctx->GX);
  mbedtls_mpi_free(&ctx->X);
  mbedtls_mpi_free(&ctx->G);
  mbedtls_mpi_free(&ctx->P);
  lVar1 = 0;
  do {
    *(undefined1 *)((long)&ctx->len + lVar1) = 0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xf8);
  return;
}

Assistant:

void mbedtls_dhm_free( mbedtls_dhm_context *ctx )
{
    mbedtls_mpi_free( &ctx->pX ); mbedtls_mpi_free( &ctx->Vf );
    mbedtls_mpi_free( &ctx->Vi ); mbedtls_mpi_free( &ctx->RP );
    mbedtls_mpi_free( &ctx->K  ); mbedtls_mpi_free( &ctx->GY );
    mbedtls_mpi_free( &ctx->GX ); mbedtls_mpi_free( &ctx->X  );
    mbedtls_mpi_free( &ctx->G  ); mbedtls_mpi_free( &ctx->P  );

    mbedtls_zeroize( ctx, sizeof( mbedtls_dhm_context ) );
}